

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

DescriptorProto_ExtensionRange *
google::protobuf::Arena::CreateMaybeMessage<google::protobuf::DescriptorProto_ExtensionRange>
          (Arena *arena)

{
  DescriptorProto_ExtensionRange *this;
  
  if (arena == (Arena *)0x0) {
    this = (DescriptorProto_ExtensionRange *)operator_new(0x28);
    DescriptorProto_ExtensionRange::DescriptorProto_ExtensionRange(this);
  }
  else {
    AllocHook(arena,(type_info *)&DescriptorProto_ExtensionRange::typeinfo,0x28);
    this = (DescriptorProto_ExtensionRange *)AllocateAlignedNoHook(arena,0x28);
    DescriptorProto_ExtensionRange::DescriptorProto_ExtensionRange(this,arena);
  }
  return this;
}

Assistant:

PROTOBUF_NOINLINE PROTOBUF_NAMESPACE_ID::DescriptorProto_ExtensionRange* Arena::CreateMaybeMessage< PROTOBUF_NAMESPACE_ID::DescriptorProto_ExtensionRange >(Arena* arena) {
  return Arena::CreateMessageInternal< PROTOBUF_NAMESPACE_ID::DescriptorProto_ExtensionRange >(arena);
}